

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellANCF_3423.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementShellANCF_3423::ComputeInternalForces
          (ChElementShellANCF_3423 *this,ChVectorDynamic<> *Fi)

{
  ChMatrixNM<double,_8,_3> *d;
  pointer pMVar1;
  pointer pdVar2;
  ChLog *this_00;
  ChStreamOutAscii *pCVar3;
  ulong uVar4;
  uint unVal;
  RealScalar dVal;
  ShellANCF_Force formula;
  ChVectorN<double,_5> alphaEAS;
  ChVectorN<double,_5> HE;
  ChVectorN<double,_5> sol;
  ChVectorN<double,_24> Finternal;
  ChMatrixNM<double,_5,_5> KALPHA;
  ChVectorN<double,_54> result;
  Solve<Eigen::ColPivHouseholderQR<Eigen::Matrix<double,_5,_5,_1,_5,_5>_>,_Eigen::Matrix<double,_5,_1,_0,_5,_1>_>
  local_670;
  ChIntegrable3D<Eigen::Matrix<double,_54,_1,_0,_54,_1>_> local_660;
  ChElementShellANCF_3423 *local_658;
  ulong local_650;
  Matrix<double,_5,_1,_0,_5,_1> *local_648;
  Matrix<double,_5,_1,_0,_5,_1> local_640;
  Matrix<double,_5,_1,_0,_5,_1> local_610;
  PlainObjectBase<Eigen::Matrix<double,5,1,0,5,1>> local_5e8 [40];
  Matrix<double,_24,_1,_0,_24,_1> local_5c0;
  EigenBase<Eigen::Matrix<double,_5,_5,_1,_5,_5>_> local_4c8 [200];
  Product<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_Eigen::Transpose<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>,_0>
  local_400 [29];
  DenseBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_> local_230 [512];
  
  d = &this->m_d;
  CalcCoordMatrix(this,d);
  CalcCoordDerivMatrix(this,&this->m_d_dt);
  local_400[0].m_lhs = d;
  local_400[0].m_rhs.m_matrix = d;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,8,8,1,8,8>,Eigen::Product<Eigen::Matrix<double,8,3,1,8,3>,Eigen::Transpose<Eigen::Matrix<double,8,3,1,8,3>>,0>>
            (&this->m_ddT,local_400);
  CalcStrainANSbilinearShell(this);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)Fi);
  uVar4 = 0;
  do {
    if (this->m_numLayers <= uVar4) {
      return;
    }
    pMVar1 = (this->m_alphaEAS).
             super__Vector_base<Eigen::Matrix<double,_5,_1,_0,_5,_1>,_std::allocator<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_640.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.m_data.array[4]
         = *(double *)
            ((long)&pMVar1[uVar4].super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.
                    m_storage.m_data + 0x20);
    pMVar1 = pMVar1 + uVar4;
    local_640.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.m_data.array[0]
         = (pMVar1->super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>).m_storage.m_data.
           array[0];
    local_640.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.m_data.array[1]
         = *(double *)
            ((long)&(pMVar1->super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>).m_storage
                    .m_data + 8);
    local_640.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.m_data.array[2]
         = *(double *)
            ((long)&(pMVar1->super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>).m_storage
                    .m_data + 0x10);
    local_640.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.m_data.array[3]
         = *(double *)
            ((long)&(pMVar1->super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>).m_storage
                    .m_data + 0x18);
    for (unVal = 0; unVal != 100; unVal = unVal + 1) {
      local_648 = &local_640;
      local_660._vptr_ChIntegrable3D = (_func_int **)&PTR__ChIntegrable3D_01183680;
      local_658 = this;
      local_650 = uVar4;
      Eigen::DenseBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>::setZero(local_230);
      pdVar2 = (this->m_GaussZ).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      ChQuadrature::Integrate3D<Eigen::Matrix<double,54,1,0,54,1>>
                ((Matrix<double,_54,_1,_0,_54,_1> *)local_230,&local_660,-1.0,1.0,-1.0,1.0,
                 pdVar2[uVar4],pdVar2[uVar4 + 1],2);
      Eigen::VectorBlock<Eigen::Matrix<double,_54,_1,_0,_54,_1>,_-1>::VectorBlock
                ((VectorBlock<Eigen::Matrix<double,_54,_1,_0,_54,_1>,__1> *)local_400,
                 (Matrix<double,_54,_1,_0,_54,_1> *)local_230,0,0x18);
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,24,1,0,24,1>,Eigen::Block<Eigen::Matrix<double,54,1,0,54,1>,_1,1,false>>
                (&local_5c0,(Block<Eigen::Matrix<double,_54,_1,_0,_54,_1>,__1,_1,_false> *)local_400
                );
      Eigen::VectorBlock<Eigen::Matrix<double,_54,_1,_0,_54,_1>,_-1>::VectorBlock
                ((VectorBlock<Eigen::Matrix<double,_54,_1,_0,_54,_1>,__1> *)local_400,
                 (Matrix<double,_54,_1,_0,_54,_1> *)local_230,0x18,5);
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,5,1,0,5,1>,Eigen::Block<Eigen::Matrix<double,54,1,0,54,1>,_1,1,false>>
                (&local_610,(Block<Eigen::Matrix<double,_54,_1,_0,_54,_1>,__1,_1,_false> *)local_400
                );
      Eigen::VectorBlock<Eigen::Matrix<double,_54,_1,_0,_54,_1>,_-1>::VectorBlock
                ((VectorBlock<Eigen::Matrix<double,_54,_1,_0,_54,_1>,__1> *)local_400,
                 (Matrix<double,_54,_1,_0,_54,_1> *)local_230,0x1d,0x19);
      Eigen::MapBase<Eigen::Map<Eigen::Matrix<double,_5,_5,_1,_5,_5>,_0,_Eigen::Stride<0,_0>_>,_0>::
      MapBase((MapBase<Eigen::Map<Eigen::Matrix<double,_5,_5,_1,_5,_5>,_0,_Eigen::Stride<0,_0>_>,_0>
               *)local_5e8,(PointerType)local_400[0].m_lhs,5,5);
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,5,5,1,5,5>,Eigen::Map<Eigen::Matrix<double,5,5,1,5,5>,0,Eigen::Stride<0,0>>>
                ((Matrix<double,_5,_5,_1,_5,_5> *)local_4c8,
                 (Map<Eigen::Matrix<double,_5,_5,_1,_5,_5>,_0,_Eigen::Stride<0,_0>_> *)local_5e8);
      dVal = Eigen::MatrixBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>::norm
                       ((MatrixBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_> *)&local_610);
      if (dVal < 1e-05) break;
      Eigen::ColPivHouseholderQR<Eigen::Matrix<double,5,5,1,5,5>>::
      ColPivHouseholderQR<Eigen::Matrix<double,5,5,1,5,5>>
                ((ColPivHouseholderQR<Eigen::Matrix<double,5,5,1,5,5>> *)local_400,local_4c8);
      local_670 = Eigen::SolverBase<Eigen::ColPivHouseholderQR<Eigen::Matrix<double,5,5,1,5,5>>>::
                  solve<Eigen::Matrix<double,5,1,0,5,1>>
                            ((SolverBase<Eigen::ColPivHouseholderQR<Eigen::Matrix<double,5,5,1,5,5>>>
                              *)local_400,
                             (MatrixBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_> *)&local_610);
      Eigen::PlainObjectBase<Eigen::Matrix<double,5,1,0,5,1>>::
      PlainObjectBase<Eigen::Solve<Eigen::ColPivHouseholderQR<Eigen::Matrix<double,5,5,1,5,5>>,Eigen::Matrix<double,5,1,0,5,1>>>
                (local_5e8,
                 (DenseBase<Eigen::Solve<Eigen::ColPivHouseholderQR<Eigen::Matrix<double,_5,_5,_1,_5,_5>_>,_Eigen::Matrix<double,_5,_1,_0,_5,_1>_>_>
                  *)&local_670);
      Eigen::MatrixBase<Eigen::Matrix<double,5,1,0,5,1>>::operator-=
                ((MatrixBase<Eigen::Matrix<double,5,1,0,5,1>> *)&local_640,
                 (MatrixBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_> *)local_5e8);
      if (1 < unVal) {
        this_00 = GetLog();
        pCVar3 = ChStreamOutAscii::operator<<(&this_00->super_ChStreamOutAscii,"  count ");
        pCVar3 = ChStreamOutAscii::operator<<(pCVar3,unVal);
        pCVar3 = ChStreamOutAscii::operator<<(pCVar3,"  NormHE ");
        pCVar3 = ChStreamOutAscii::operator<<(pCVar3,dVal);
        ChStreamOutAscii::operator<<(pCVar3,"\n");
      }
    }
    Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator-=
              ((MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)Fi,
               (MatrixBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>_> *)&local_5c0);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,5,1,0,5,1>,Eigen::Matrix<double,5,1,0,5,1>>
              ((this->m_alphaEAS).
               super__Vector_base<Eigen::Matrix<double,_5,_1,_0,_5,_1>,_std::allocator<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>_>
               ._M_impl.super__Vector_impl_data._M_start + uVar4,&local_640);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,5,5,1,5,5>,Eigen::Matrix<double,5,5,1,5,5>>
              ((this->m_KalphaEAS).
               super__Vector_base<Eigen::Matrix<double,_5,_5,_1,_5,_5>,_std::allocator<Eigen::Matrix<double,_5,_5,_1,_5,_5>_>_>
               ._M_impl.super__Vector_impl_data._M_start + uVar4,
               (Matrix<double,_5,_5,_1,_5,_5> *)local_4c8);
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

void ChElementShellANCF_3423::ComputeInternalForces(ChVectorDynamic<>& Fi) {
    // Current nodal coordinates and velocities
    CalcCoordMatrix(m_d);
    CalcCoordDerivMatrix(m_d_dt);
    m_ddT = m_d * m_d.transpose();
    // Assumed Natural Strain (ANS):  Calculate m_strainANS and m_strainANS_D
    CalcStrainANSbilinearShell();

    Fi.setZero();

    for (size_t kl = 0; kl < m_numLayers; kl++) {
        ChVectorN<double, 24> Finternal;
        ChVectorN<double, 5> HE;
        ChMatrixNM<double, 5, 5> KALPHA;

        // Initial guess for EAS parameters
        ChVectorN<double, 5> alphaEAS = m_alphaEAS[kl];

        // Newton loop for EAS
        for (int count = 0; count < m_maxIterationsEAS; count++) {
            ShellANCF_Force formula(this, kl, &alphaEAS);
            ChVectorN<double, 54> result;
            result.setZero();
            ChQuadrature::Integrate3D<ChVectorN<double, 54>>(result,                          // result of integration
                                                             formula,                         // integrand formula
                                                             -1, 1,                           // x limits
                                                             -1, 1,                           // y limits
                                                             m_GaussZ[kl], m_GaussZ[kl + 1],  // z limits
                                                             2                                // order of integration
            );

            // Extract vectors and matrices from result of integration
            Finternal = result.segment(0, 24);
            HE = result.segment(24, 5);
            KALPHA = Eigen::Map<ChMatrixNM<double, 5, 5>>(result.segment(29, 5 * 5).data(), 5, 5);

            // Check convergence (residual check)
            double norm_HE = HE.norm();
            if (norm_HE < m_toleranceEAS)
                break;

            // Calculate increment and update EAS parameters
            ChVectorN<double, 5> sol = KALPHA.colPivHouseholderQr().solve(HE);
            alphaEAS -= sol;

            if (count >= 2)
                GetLog() << "  count " << count << "  NormHE " << norm_HE << "\n";
        }

        // Accumulate internal force
        Fi -= Finternal;

        // Cache alphaEAS and KALPHA for use in Jacobian calculation
        m_alphaEAS[kl] = alphaEAS;
        m_KalphaEAS[kl] = KALPHA;

    }  // Layer Loop
}